

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::MissMatchObjectTest::MissMatchObjectTest
          (MissMatchObjectTest *this,Context *context)

{
  testCase *test_case;
  GLuint i;
  Context *context_local;
  MissMatchObjectTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"missmatch_object",
             "Test verifies if INVALID_VALUE is generated when object & target provided to CopySubImageData do not match"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MissMatchObjectTest_0321e730;
  this->m_dst_name = 0;
  this->m_src_name = 0;
  this->m_test_case_index = 0;
  std::
  vector<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
  ::vector(&this->m_test_cases);
  for (test_case._4_4_ = 0; test_case._4_4_ < 8; test_case._4_4_ = test_case._4_4_ + 1) {
    std::
    vector<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
    ::push_back(&this->m_test_cases,MissMatchObjectTest::test_cases + test_case._4_4_);
  }
  return;
}

Assistant:

MissMatchObjectTest::MissMatchObjectTest(deqp::Context& context)
	: TestCase(
		  context, "missmatch_object",
		  "Test verifies if INVALID_VALUE is generated when object & target provided to CopySubImageData do not match")
	, m_dst_name(0)
	, m_src_name(0)
	, m_test_case_index(0)
{
	static const testCase test_cases[] = { { GL_TEXTURE_2D, GL_TEXTURE_2D, GL_TEXTURE_2D, GL_NO_ERROR },
										   { GL_TEXTURE_2D, GL_RENDERBUFFER, GL_TEXTURE_2D, GL_INVALID_VALUE },
										   { GL_TEXTURE_2D, GL_TEXTURE_2D, GL_RENDERBUFFER, GL_INVALID_VALUE },
										   { GL_TEXTURE_2D, GL_RENDERBUFFER, GL_RENDERBUFFER, GL_INVALID_VALUE },
										   { GL_RENDERBUFFER, GL_TEXTURE_2D, GL_TEXTURE_2D, GL_INVALID_VALUE },
										   { GL_RENDERBUFFER, GL_RENDERBUFFER, GL_TEXTURE_2D, GL_INVALID_VALUE },
										   { GL_RENDERBUFFER, GL_TEXTURE_2D, GL_RENDERBUFFER, GL_INVALID_VALUE },
										   { GL_RENDERBUFFER, GL_RENDERBUFFER, GL_RENDERBUFFER, GL_NO_ERROR } };

	static const GLuint n_test_cases = sizeof(test_cases) / sizeof(testCase);

	for (GLuint i = 0; i < n_test_cases; ++i)
	{
		const testCase& test_case = test_cases[i];

		m_test_cases.push_back(test_case);
	}
}